

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddVirtualOne
              (WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUsable,u16 mExclude,
              sqlite3_index_info *pIdxInfo,u16 mNoOmit,int *pbIn,int *pbRetryLimit)

{
  u32 *puVar1;
  int *piVar2;
  u16 *puVar3;
  byte *pbVar4;
  Table **ppTVar5;
  double dVar6;
  byte bVar7;
  WhereClause *pWVar8;
  sqlite3_index_constraint_usage *__s;
  WhereLoop *pTemplate;
  Parse *pParse;
  SrcList *pSVar9;
  VTable *pVVar10;
  sqlite3_vtab *psVar11;
  sqlite3 *db;
  i8 iVar12;
  LogEst LVar13;
  uint uVar14;
  sqlite3_index_constraint *psVar15;
  ulong uVar16;
  VTable **ppVVar17;
  ulong uVar18;
  uint uVar19;
  char *pcVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  WhereClause *pWVar24;
  WhereTerm *pWVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  int iVar29;
  VTable **ppVVar30;
  
  pWVar8 = pBuilder->pWC;
  __s = pIdxInfo->aConstraintUsage;
  pTemplate = pBuilder->pNew;
  pParse = pBuilder->pWInfo->pParse;
  pSVar9 = pBuilder->pWInfo->pTabList;
  bVar7 = pTemplate->iTab;
  iVar22 = pIdxInfo->nConstraint;
  uVar21 = (ulong)iVar22;
  *pbIn = 0;
  pTemplate->prereq = mPrereq;
  if (0 < (long)uVar21) {
    psVar15 = pIdxInfo->aConstraint;
    iVar27 = pWVar8->nTerm;
    iVar23 = 0;
    do {
      iVar29 = psVar15->iTermOffset;
      pWVar24 = pWVar8;
      iVar26 = iVar27;
      if (iVar27 <= iVar29) {
        do {
          iVar29 = iVar29 - iVar26;
          pWVar24 = pWVar24->pOuter;
          iVar26 = pWVar24->nTerm;
        } while (iVar26 <= iVar29);
      }
      pWVar25 = pWVar24->a;
      psVar15->usable = '\0';
      if ((((pWVar25[iVar29].prereqRight & ~mUsable) == 0) &&
          ((pWVar25[iVar29].eOperator & mExclude) == 0)) &&
         ((pbRetryLimit != (int *)0x0 || ((byte)(pWVar25[iVar29].eMatchOp + 0xb5) < 0xfe)))) {
        psVar15->usable = '\x01';
      }
      iVar23 = iVar23 + 1;
      psVar15 = psVar15 + 1;
    } while (iVar23 != iVar22);
  }
  memset(__s,0,uVar21 * 8);
  pIdxInfo->idxStr = (char *)0x0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = 5e+98;
  pIdxInfo->estimatedRows = 0x19;
  pIdxInfo->idxFlags = 0;
  *(undefined4 *)&pIdxInfo[1].aOrderBy = 0;
  ppTVar5 = &pSVar9->a[bVar7].pSTab;
  ppVVar30 = &((*ppTVar5)->u).vtab.p;
  ppVVar17 = ppVVar30;
  do {
    pVVar10 = *ppVVar17;
    ppVVar17 = &pVVar10->pNext;
  } while (pVVar10->db != pParse->db);
  psVar11 = pVVar10->pVtab;
  puVar1 = &pParse->db->nSchemaLock;
  *puVar1 = *puVar1 + 1;
  uVar14 = (*psVar11->pModule->xBestIndex)(psVar11,pIdxInfo);
  db = pParse->db;
  puVar1 = &db->nSchemaLock;
  *puVar1 = *puVar1 - 1;
  if ((uVar14 != 0) && (uVar14 != 0x13)) {
    if (uVar14 == 7) {
      sqlite3OomFault(db);
    }
    else {
      pcVar20 = psVar11->zErrMsg;
      if (pcVar20 == (char *)0x0) {
        if (uVar14 == 0x204) {
          pcVar20 = "abort due to ROLLBACK";
        }
        else if (uVar14 == 0x65) {
          pcVar20 = "no more rows available";
        }
        else if (uVar14 == 100) {
          pcVar20 = "another row available";
        }
        else {
          uVar19 = uVar14 & 0xff;
          pcVar20 = "unknown error";
          if ((uVar19 < 0x1d) && ((0x1410004UL >> ((ulong)uVar19 & 0x3f) & 1) == 0)) {
            pcVar20 = (&sqlite3ErrStr_aMsg)[uVar19];
          }
        }
      }
      sqlite3ErrorMsg(pParse,"%s",pcVar20);
    }
  }
  if (((*ppVVar30)->bAllSchemas != '\0') && (iVar27 = pParse->db->nDb, 0 < iVar27)) {
    iVar23 = 0;
    do {
      sqlite3CodeVerifySchema(pParse,iVar23);
      iVar23 = iVar23 + 1;
    } while (iVar27 != iVar23);
    if (pParse->writeMask != 0) {
      iVar23 = 0;
      do {
        sqlite3BeginWriteOperation(pParse,0,iVar23);
        iVar23 = iVar23 + 1;
      } while (iVar27 != iVar23);
    }
  }
  sqlite3_free(psVar11->zErrMsg);
  psVar11->zErrMsg = (char *)0x0;
  if (uVar14 == 0) {
    memset(pTemplate->aLTerm,0,uVar21 * 8);
    *(undefined8 *)&pTemplate->u = 0;
    (pTemplate->u).btree.pIndex = (Index *)0x0;
    (pTemplate->u).btree.pOrderBy = (ExprList *)0x0;
    if (iVar22 < 1) {
      pTemplate->nLTerm = 0;
    }
    else {
      psVar15 = pIdxInfo->aConstraint;
      uVar14 = 0xffffffff;
      uVar16 = 0;
      do {
        iVar27 = __s[uVar16].argvIndex;
        if (0 < iVar27) {
          if (((iVar27 <= iVar22) && (-1 < psVar15->iTermOffset)) && (pWVar8 != (WhereClause *)0x0))
          {
            uVar19 = iVar27 - 1;
            pWVar24 = pWVar8;
            iVar27 = psVar15->iTermOffset;
            while (piVar2 = &pWVar24->nTerm, *piVar2 <= iVar27) {
              pWVar24 = pWVar24->pOuter;
              iVar27 = iVar27 - *piVar2;
              if (pWVar24 == (WhereClause *)0x0) goto LAB_0019c210;
            }
            if (pWVar24->a != (WhereTerm *)0x0) {
              if ((pTemplate->aLTerm[uVar19] == (WhereTerm *)0x0) && (psVar15->usable != '\0')) {
                pWVar25 = pWVar24->a + iVar27;
                pTemplate->prereq = pTemplate->prereq | pWVar25->prereqRight;
                pTemplate->aLTerm[uVar19] = pWVar25;
                if ((int)uVar14 < (int)uVar19) {
                  uVar14 = uVar19;
                }
                if (__s[uVar16].omit != '\0') {
                  if ((uVar16 < 0x10) && ((mNoOmit >> ((uint)uVar16 & 0x1f) & 1) == 0)) {
                    puVar3 = &(pTemplate->u).btree.nDistinctCol;
                    *puVar3 = *puVar3 | (ushort)(1 << ((byte)uVar19 & 0x1f));
                  }
                  if (pWVar25->eMatchOp == 'J') {
                    pbVar4 = (byte *)((long)&pTemplate->u + 4);
                    *pbVar4 = *pbVar4 | 2;
                  }
                }
                uVar28 = 1 << ((byte)uVar16 & 0x1f);
                if (0x1f < uVar16) {
                  uVar28 = 0;
                }
                if ((*(uint *)&pIdxInfo[1].aOrderBy & uVar28) == 0) {
                  if ((pWVar25->eOperator & 1) != 0) {
                    pIdxInfo->orderByConsumed = 0;
                    *(byte *)&pIdxInfo->idxFlags = (byte)pIdxInfo->idxFlags & 0xfe;
                    *pbIn = 1;
                  }
                }
                else {
                  puVar1 = &(pTemplate->u).vtab.mHandleIn;
                  *puVar1 = *puVar1 | 1 << ((byte)uVar19 & 0x1f);
                }
                if (0xfd < (byte)(pWVar25->eMatchOp + 0xb5)) {
                  if (*pbIn != 0) {
LAB_0019c3b7:
                    if (pIdxInfo->needToFreeIdxStr != 0) {
                      sqlite3_free(pIdxInfo->idxStr);
                      pIdxInfo->idxStr = (char *)0x0;
                      pIdxInfo->needToFreeIdxStr = 0;
                    }
                    *pbRetryLimit = 1;
                    return 0;
                  }
                  if (uVar16 != 0) {
                    uVar18 = 0;
                    do {
                      if (__s[uVar18].argvIndex < 1) goto LAB_0019c3b7;
                      uVar18 = uVar18 + 1;
                    } while (uVar16 != uVar18);
                  }
                }
                goto LAB_0019c1d9;
              }
            }
          }
LAB_0019c210:
          sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",(*ppTVar5)->zName);
          iVar22 = 1;
          goto LAB_0019c235;
        }
LAB_0019c1d9:
        uVar16 = uVar16 + 1;
        psVar15 = psVar15 + 1;
      } while (uVar16 != uVar21);
      pTemplate->nLTerm = (u16)(uVar14 + 1);
      if (-1 < (int)uVar14) {
        uVar21 = 0;
        do {
          if (pTemplate->aLTerm[uVar21] == (WhereTerm *)0x0) {
            sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",(*ppTVar5)->zName);
            iVar22 = 1;
            goto LAB_0019c235;
          }
          uVar21 = uVar21 + 1;
        } while (uVar14 + 1 != uVar21);
      }
    }
    (pTemplate->u).vtab.idxNum = pIdxInfo->idxNum;
    *(byte *)((long)&pTemplate->u + 4) =
         *(byte *)((long)&pTemplate->u + 4) & 0xfe | (byte)pIdxInfo->needToFreeIdxStr & 1;
    pIdxInfo->needToFreeIdxStr = 0;
    (pTemplate->u).btree.pIndex = (Index *)pIdxInfo->idxStr;
    if (pIdxInfo->orderByConsumed == 0) {
      iVar12 = '\0';
    }
    else {
      iVar12 = (i8)pIdxInfo->nOrderBy;
    }
    (pTemplate->u).vtab.isOrdered = iVar12;
    *(byte *)((long)&pTemplate->u + 4) =
         *(byte *)((long)&pTemplate->u + 4) & 0xfb | (char)pIdxInfo->idxFlags * '\x02' & 4U;
    pTemplate->rSetup = 0;
    dVar6 = pIdxInfo->estimatedCost;
    if (dVar6 <= 1.0) {
      LVar13 = 0;
    }
    else if (dVar6 <= 2000000000.0) {
      LVar13 = sqlite3LogEst((long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f |
                             (long)dVar6);
    }
    else {
      LVar13 = (ushort)((ulong)dVar6 >> 0x34) * 10 + -0x27ec;
    }
    pTemplate->rRun = LVar13;
    LVar13 = sqlite3LogEst(pIdxInfo->estimatedRows);
    pTemplate->nOut = LVar13;
    pTemplate->wsFlags = (pIdxInfo->idxFlags & 1U) << 0xc | pTemplate->wsFlags & 0xffffefff;
    iVar22 = whereLoopInsert(pBuilder,pTemplate);
    if ((undefined1  [24])((undefined1  [24])pTemplate->u & (undefined1  [24])0x100000000) !=
        (undefined1  [24])0x0) {
      sqlite3_free((pTemplate->u).btree.pIndex);
      pbVar4 = (byte *)((long)&pTemplate->u + 4);
      *pbVar4 = *pbVar4 & 0xfe;
    }
    return iVar22;
  }
  if (uVar14 != 0x13) {
    return uVar14;
  }
  iVar22 = 0;
LAB_0019c235:
  if (pIdxInfo->needToFreeIdxStr == 0) {
    return iVar22;
  }
  sqlite3_free(pIdxInfo->idxStr);
  pIdxInfo->idxStr = (char *)0x0;
  pIdxInfo->needToFreeIdxStr = 0;
  return iVar22;
}

Assistant:

static int whereLoopAddVirtualOne(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,                /* Mask of tables that must be used. */
  Bitmask mUsable,                /* Mask of usable tables */
  u16 mExclude,                   /* Exclude terms using these operators */
  sqlite3_index_info *pIdxInfo,   /* Populated object for xBestIndex */
  u16 mNoOmit,                    /* Do not omit these constraints */
  int *pbIn,                      /* OUT: True if plan uses an IN(...) op */
  int *pbRetryLimit               /* OUT: Retry without LIMIT/OFFSET */
){
  WhereClause *pWC = pBuilder->pWC;
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_constraint_usage *pUsage = pIdxInfo->aConstraintUsage;
  int i;
  int mxTerm;
  int rc = SQLITE_OK;
  WhereLoop *pNew = pBuilder->pNew;
  Parse *pParse = pBuilder->pWInfo->pParse;
  SrcItem *pSrc = &pBuilder->pWInfo->pTabList->a[pNew->iTab];
  int nConstraint = pIdxInfo->nConstraint;

  assert( (mUsable & mPrereq)==mPrereq );
  *pbIn = 0;
  pNew->prereq = mPrereq;

  /* Set the usable flag on the subset of constraints identified by
  ** arguments mUsable and mExclude. */
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    WhereTerm *pTerm = termFromWhereClause(pWC, pIdxCons->iTermOffset);
    pIdxCons->usable = 0;
    if( (pTerm->prereqRight & mUsable)==pTerm->prereqRight
     && (pTerm->eOperator & mExclude)==0
     && (pbRetryLimit || !isLimitTerm(pTerm))
    ){
      pIdxCons->usable = 1;
    }
  }

  /* Initialize the output fields of the sqlite3_index_info structure */
  memset(pUsage, 0, sizeof(pUsage[0])*nConstraint);
  assert( pIdxInfo->needToFreeIdxStr==0 );
  pIdxInfo->idxStr = 0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = SQLITE_BIG_DBL / (double)2;
  pIdxInfo->estimatedRows = 25;
  pIdxInfo->idxFlags = 0;
  pHidden->mHandleIn = 0;

  /* Invoke the virtual table xBestIndex() method */
  rc = vtabBestIndex(pParse, pSrc->pSTab, pIdxInfo);
  if( rc ){
    if( rc==SQLITE_CONSTRAINT ){
      /* If the xBestIndex method returns SQLITE_CONSTRAINT, that means
      ** that the particular combination of parameters provided is unusable.
      ** Make no entries in the loop table.
      */
      WHERETRACE(0xffffffff, ("  ^^^^--- non-viable plan rejected!\n"));
      freeIdxStr(pIdxInfo);
      return SQLITE_OK;
    }
    return rc;
  }

  mxTerm = -1;
  assert( pNew->nLSlot>=nConstraint );
  memset(pNew->aLTerm, 0, sizeof(pNew->aLTerm[0])*nConstraint );
  memset(&pNew->u.vtab, 0, sizeof(pNew->u.vtab));
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    int iTerm;
    if( (iTerm = pUsage[i].argvIndex - 1)>=0 ){
      WhereTerm *pTerm;
      int j = pIdxCons->iTermOffset;
      if( iTerm>=nConstraint
       || j<0
       || (pTerm = termFromWhereClause(pWC, j))==0
       || pNew->aLTerm[iTerm]!=0
       || pIdxCons->usable==0
      ){
        sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pSTab->zName);
        freeIdxStr(pIdxInfo);
        return SQLITE_ERROR;
      }
      testcase( iTerm==nConstraint-1 );
      testcase( j==0 );
      testcase( j==pWC->nTerm-1 );
      pNew->prereq |= pTerm->prereqRight;
      assert( iTerm<pNew->nLSlot );
      pNew->aLTerm[iTerm] = pTerm;
      if( iTerm>mxTerm ) mxTerm = iTerm;
      testcase( iTerm==15 );
      testcase( iTerm==16 );
      if( pUsage[i].omit ){
        if( i<16 && ((1<<i)&mNoOmit)==0 ){
          testcase( i!=iTerm );
          pNew->u.vtab.omitMask |= 1<<iTerm;
        }else{
          testcase( i!=iTerm );
        }
        if( pTerm->eMatchOp==SQLITE_INDEX_CONSTRAINT_OFFSET ){
          pNew->u.vtab.bOmitOffset = 1;
        }
      }
      if( SMASKBIT32(i) & pHidden->mHandleIn ){
        pNew->u.vtab.mHandleIn |= MASKBIT32(iTerm);
      }else if( (pTerm->eOperator & WO_IN)!=0 ){
        /* A virtual table that is constrained by an IN clause may not
        ** consume the ORDER BY clause because (1) the order of IN terms
        ** is not necessarily related to the order of output terms and
        ** (2) Multiple outputs from a single IN value will not merge
        ** together.  */
        pIdxInfo->orderByConsumed = 0;
        pIdxInfo->idxFlags &= ~SQLITE_INDEX_SCAN_UNIQUE;
        *pbIn = 1; assert( (mExclude & WO_IN)==0 );
      }

      /* Unless pbRetryLimit is non-NULL, there should be no LIMIT/OFFSET
      ** terms. And if there are any, they should follow all other terms. */
      assert( pbRetryLimit || !isLimitTerm(pTerm) );
      assert( !isLimitTerm(pTerm) || i>=nConstraint-2 );
      assert( !isLimitTerm(pTerm) || i==nConstraint-1 || isLimitTerm(pTerm+1) );

      if( isLimitTerm(pTerm) && (*pbIn || !allConstraintsUsed(pUsage, i)) ){
        /* If there is an IN(...) term handled as an == (separate call to
        ** xFilter for each value on the RHS of the IN) and a LIMIT or
        ** OFFSET term handled as well, the plan is unusable. Similarly,
        ** if there is a LIMIT/OFFSET and there are other unused terms,
        ** the plan cannot be used. In these cases set variable *pbRetryLimit
        ** to true to tell the caller to retry with LIMIT and OFFSET
        ** disabled. */
        freeIdxStr(pIdxInfo);
        *pbRetryLimit = 1;
        return SQLITE_OK;
      }
    }
  }

  pNew->nLTerm = mxTerm+1;
  for(i=0; i<=mxTerm; i++){
    if( pNew->aLTerm[i]==0 ){
      /* The non-zero argvIdx values must be contiguous.  Raise an
      ** error if they are not */
      sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pSTab->zName);
      freeIdxStr(pIdxInfo);
      return SQLITE_ERROR;
    }
  }
  assert( pNew->nLTerm<=pNew->nLSlot );
  pNew->u.vtab.idxNum = pIdxInfo->idxNum;
  pNew->u.vtab.needFree = pIdxInfo->needToFreeIdxStr;
  pIdxInfo->needToFreeIdxStr = 0;
  pNew->u.vtab.idxStr = pIdxInfo->idxStr;
  pNew->u.vtab.isOrdered = (i8)(pIdxInfo->orderByConsumed ?
      pIdxInfo->nOrderBy : 0);
  pNew->u.vtab.bIdxNumHex = (pIdxInfo->idxFlags&SQLITE_INDEX_SCAN_HEX)!=0;
  pNew->rSetup = 0;
  pNew->rRun = sqlite3LogEstFromDouble(pIdxInfo->estimatedCost);
  pNew->nOut = sqlite3LogEst(pIdxInfo->estimatedRows);

  /* Set the WHERE_ONEROW flag if the xBestIndex() method indicated
  ** that the scan will visit at most one row. Clear it otherwise. */
  if( pIdxInfo->idxFlags & SQLITE_INDEX_SCAN_UNIQUE ){
    pNew->wsFlags |= WHERE_ONEROW;
  }else{
    pNew->wsFlags &= ~WHERE_ONEROW;
  }
  rc = whereLoopInsert(pBuilder, pNew);
  if( pNew->u.vtab.needFree ){
    sqlite3_free(pNew->u.vtab.idxStr);
    pNew->u.vtab.needFree = 0;
  }
  WHERETRACE(0xffffffff, ("  bIn=%d prereqIn=%04llx prereqOut=%04llx\n",
                      *pbIn, (sqlite3_uint64)mPrereq,
                      (sqlite3_uint64)(pNew->prereq & ~mPrereq)));

  return rc;
}